

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

uint32_t __thiscall
front::syntax::SyntaxAnalyze::gm_const_init_val
          (SyntaxAnalyze *this,
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *init_values,
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *dimensions,uint32_t braceLayerNum)

{
  pointer pWVar1;
  pointer psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  uint32_t uVar6;
  pointer psVar7;
  ExpressNode *this_00;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  value_type local_78;
  uint32_t local_5c;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  vector<front::word::Word,_std::allocator<front::word::Word>_> *local_40;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_38;
  
  psVar7 = (dimensions->
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(dimensions->
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4;
  uVar8 = (ulong)(int)braceLayerNum;
  uVar12 = 1;
  if (uVar8 < uVar10) {
    psVar7 = psVar7 + uVar8;
    do {
      uVar12 = uVar12 * ((psVar7->
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->_value;
      uVar8 = uVar8 + 1;
      psVar7 = psVar7 + 1;
    } while (uVar8 < uVar10);
  }
  local_5c = braceLayerNum;
  local_40 = (vector<front::word::Word,_std::allocator<front::word::Word>_> *)init_values;
  local_38 = dimensions;
  bVar5 = try_word(this,1,RBRACE,COMMA,SEMICN);
  uVar11 = 0;
  if (!bVar5) {
    local_5c = local_5c + 1;
    uVar11 = 0;
    do {
      uVar8 = this->matched_index + 1;
      pWVar1 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((uVar8 < (ulong)(((long)(this->word_list->
                                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                          -0x5555555555555555)) &&
         (bVar5 = word::Word::match_token(pWVar1 + uVar8,LBRACE), bVar5)) {
        match_one_word(this,LBRACE);
        uVar6 = gm_const_init_val(this,(vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                        *)local_40,local_38,local_5c);
        uVar11 = uVar11 + uVar6;
        match_one_word(this,RBRACE);
      }
      else {
        local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        gm_exp((SyntaxAnalyze *)&local_58);
        _Var4._M_pi = a_Stack_50[0]._M_pi;
        local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = local_58;
        _Var3._M_pi = local_78.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_58 = (element_type *)0x0;
        a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var4._M_pi;
        if ((_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi),
           a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        }
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)local_40,&local_78);
        psVar7 = (local_38->
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (local_38->
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar11 = uVar11 + 1;
        if (psVar2 == psVar7) break;
      }
      uVar8 = this->matched_index + 1;
      pWVar1 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((uVar8 < (ulong)(((long)(this->word_list->
                                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                          -0x5555555555555555)) &&
         (bVar5 = word::Word::match_token(pWVar1 + uVar8,COMMA), bVar5)) {
        match_one_word(this,COMMA);
      }
      bVar5 = try_word(this,1,RBRACE,COMMA,SEMICN);
    } while (!bVar5);
  }
  iVar9 = uVar12 - uVar11;
  if (uVar11 <= uVar12 && iVar9 != 0) {
    do {
      local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (ExpressNode *)operator_new(0x48);
      express::ExpressNode::ExpressNode(this_00);
      local_58 = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                (a_Stack_50,this_00);
      _Var4._M_pi = a_Stack_50[0]._M_pi;
      local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_58;
      _Var3._M_pi = local_78.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_58 = (element_type *)0x0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      if ((_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi),
         a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      }
      (local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_type = CNS;
      (local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_operation = NUMBER;
      (local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_value = 0;
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)local_40,&local_78);
      if (local_78.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar9 = iVar9 + -1;
      uVar11 = uVar12;
    } while (iVar9 != 0);
  }
  return uVar11;
}

Assistant:

uint32_t SyntaxAnalyze::gm_const_init_val(vector<SharedExNdPtr> &init_values,
                                          vector<SharedExNdPtr> &dimensions,
                                          uint32_t braceLayerNum) {
  uint32_t totalValueNum;
  uint32_t nowValueNum;

  totalValueNum = 1;
  for (int i = braceLayerNum; i < dimensions.size(); i++) {
    totalValueNum *= dimensions.at(i)->_value;
  }
  nowValueNum = 0;

  while (!try_word(1, Token::RBRACE, Token::COMMA, Token::SEMICN)) {
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);

      nowValueNum +=
          gm_const_init_val(init_values, dimensions, braceLayerNum + 1);

      match_one_word(Token::RBRACE);
    } else {
      nowValueNum++;
      SharedExNdPtr value;
      value = gm_const_exp();
      init_values.push_back(value);
      if (dimensions.size() == 0) {
        break;
      }
    }
    if (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
    }
  }

  for (; nowValueNum < totalValueNum; nowValueNum++) {
    SharedExNdPtr value;
    value = SharedExNdPtr(new ExpressNode());
    value->_type = NodeType::CNS;
    value->_operation = OperationType::NUMBER;
    value->_value = 0;
    init_values.push_back(value);
  }

  return nowValueNum;
}